

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O3

bool rtcPointQuery8(int *valid,RTCScene hscene,RTCPointQuery8 *query,
                   RTCPointQueryContext *userContext,RTCPointQueryFunction queryFunc,void **userPtrN
                   )

{
  bool bVar1;
  void *userPtr;
  size_t i;
  long lVar2;
  bool bVar3;
  PointQuery query1;
  RTCPointQuery local_58;
  RTCPointQueryFunction local_38;
  
  bVar3 = false;
  lVar2 = 0;
  local_38 = queryFunc;
  do {
    if (valid[lVar2] != 0) {
      local_58.x = *(float *)(query + lVar2 * 4);
      local_58.y = *(float *)(query + lVar2 * 4 + 0x20);
      local_58.z = *(float *)(query + lVar2 * 4 + 0x40);
      local_58.radius = *(float *)(query + lVar2 * 4 + 0x80);
      local_58.time = *(float *)(query + lVar2 * 4 + 0x60);
      if (userPtrN == (void **)0x0) {
        userPtr = (void *)0x0;
      }
      else {
        userPtr = userPtrN[lVar2];
      }
      bVar1 = pointQuery((Scene *)hscene,&local_58,userContext,local_38,userPtr);
      bVar3 = (bool)(bVar3 | bVar1);
      *(float *)(query + lVar2 * 4) = local_58.x;
      *(float *)(query + lVar2 * 4 + 0x20) = local_58.y;
      *(float *)(query + lVar2 * 4 + 0x40) = local_58.z;
      *(float *)(query + lVar2 * 4 + 0x80) = local_58.radius;
      *(float *)(query + lVar2 * 4 + 0x60) = local_58.time;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return bVar3;
}

Assistant:

RTC_API bool rtcPointQuery8 (const int* valid, RTCScene hscene, RTCPointQuery8* query, struct RTCPointQueryContext* userContext, RTCPointQueryFunction queryFunc, void** userPtrN)
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcPointQuery8);
    
#if defined(DEBUG)
    RTC_VERIFY_HANDLE(hscene);
    if (scene->isModified()) throw_RTCError(RTC_ERROR_INVALID_OPERATION,"scene got not committed");
    if (((size_t)valid) & 0x0F) throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "mask not aligned to 16 bytes");   
    if (((size_t)query) & 0x0F) throw_RTCError(RTC_ERROR_INVALID_ARGUMENT, "query not aligned to 16 bytes");   
#endif
    STAT(size_t cnt=0; for (size_t i=0; i<4; i++) cnt += ((int*)valid)[i] == -1;);
    STAT3(point_query.travs,cnt,cnt,cnt);

    bool changed = false;
    PointQuery8* query8 = (PointQuery8*)query;
    PointQuery query1; 
    for (size_t i=0; i<8; i++) {
      if (!valid[i]) continue;
      query8->get(i,query1);
      changed |= pointQuery(scene, (RTCPointQuery*)&query1, userContext, queryFunc, userPtrN?userPtrN[i]:NULL);
      query8->set(i,query1);
    }
    return changed;
    RTC_CATCH_END2_FALSE(scene);
  }